

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O1

enable_if_t<_std::is_same<std::decay_t<const_char_(&)[14]>,_variant<int,_basic_string<char>_>_>::value>
 __thiscall
Catch::Generators::Generators<std::variant<int,std::__cxx11::string>>::
add_generator<char_const(&)[14]>
          (Generators<std::variant<int,std::__cxx11::string>> *this,char (*val) [14])

{
  size_t sVar1;
  anon_class_1_0_00000001 local_41;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  byte local_20;
  
  local_40._0_8_ = (long)&local_40 + 0x10;
  sVar1 = strlen(*val);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,val,*val + sVar1);
  local_20 = 1;
  Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::add_generator((Generators<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,(variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_40._M_first);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[local_20]._M_data)
            (&local_41,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_40._M_first);
  return;
}

Assistant:

std::enable_if_t<!std::is_same<std::decay_t<U>, T>::value>
        add_generator( U&& val ) {
            add_generator( T( CATCH_FORWARD( val ) ) );
        }